

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.h
# Opt level: O0

bool __thiscall Kumu::Identifier<16U>::operator<(Identifier<16U> *this,Identifier<16U> *rhs)

{
  ui32_t lhs;
  uint uVar1;
  uint local_28;
  ui32_t i;
  ui32_t test_size;
  Identifier<16U> *rhs_local;
  Identifier<16U> *this_local;
  
  lhs = Size(rhs);
  uVar1 = xmin<unsigned_int>(lhs,0x10);
  local_28 = 0;
  while( true ) {
    if (uVar1 <= local_28) {
      return false;
    }
    if (this->m_Value[local_28] != rhs->m_Value[local_28]) break;
    local_28 = local_28 + 1;
  }
  return this->m_Value[local_28] < rhs->m_Value[local_28];
}

Assistant:

inline bool operator<(const Identifier& rhs) const {
	ui32_t test_size = xmin(rhs.Size(), SIZE);

	for ( ui32_t i = 0; i < test_size; i++ )
	  {
	    if ( m_Value[i] != rhs.m_Value[i] )
	      return m_Value[i] < rhs.m_Value[i];
	  }
	
	return false;
      }